

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void alphargbblend_argb32
               (quint32 *dst,uint coverage,QRgba64 *srcLinear,quint32 src,QColorTrcLut *colorProfile
               )

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  undefined7 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  unkbyte10 Var8;
  uint uVar9;
  ulong uVar10;
  QRgba64 rgb64;
  ulong uVar11;
  ulong uVar12;
  byte bVar17;
  byte bVar18;
  ushort uVar19;
  byte bVar20;
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ushort uVar23;
  undefined1 auVar15 [16];
  byte bVar31;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined2 uVar32;
  undefined1 uVar40;
  ushort uVar41;
  byte bVar42;
  ushort uVar43;
  uint uVar44;
  uint uVar46;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar45;
  undefined1 auVar38 [16];
  ushort uVar52;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar16 [16];
  undefined1 auVar37 [16];
  undefined1 uVar39;
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  
  if (coverage == 0xff000000) {
    return;
  }
  if ((coverage != 0xffffffff) || (src < 0xff000000)) {
    uVar9 = *dst;
    uVar10 = (ulong)uVar9;
    if (uVar9 >> 0x18 < 0xff) {
      uVar9 = ((coverage & 0xff) + (coverage >> 0x10 & 0xff)) * 5 + (coverage >> 8 & 0xff) * 6 >> 4;
      if (uVar9 == 0xff) {
        if (src < 0xff000000) {
          if (src == 0) {
            return;
          }
          uVar10 = (ulong)(~src >> 0x18) * ((uVar10 << 0x18 | uVar10) & 0xff00ff00ff00ff);
          uVar10 = uVar10 + 0x80008000800080 + (uVar10 >> 8 & 0xff00ff00ff00ff) >> 8 &
                   0xff00ff00ff00ff;
          src = ((uint)(uVar10 >> 0x18) | (uint)uVar10) + src;
        }
      }
      else {
        if (src == 0) {
          return;
        }
        uVar11 = (ulong)uVar9 * (((ulong)src << 0x18 | (ulong)src) & 0xff00ff00ff00ff);
        uVar11 = uVar11 + 0x80008000800080 + (uVar11 >> 8 & 0xff00ff00ff00ff);
        uVar12 = uVar11 >> 8 & 0xff00ff00ff00ff;
        uVar10 = ((uVar10 << 0x18 | uVar10) & 0xff00ff00ff00ff) * (~uVar11 >> 0x38);
        uVar10 = uVar10 + 0x80008000800080 + (uVar10 >> 8 & 0xff00ff00ff00ff) >> 8 &
                 0xff00ff00ff00ff;
        src = ((uint)(uVar10 >> 0x18) | (uint)uVar10) + ((uint)(uVar12 >> 0x18) | (uint)uVar12);
      }
    }
    else {
      bVar17 = (byte)(uVar9 >> 8);
      bVar18 = (byte)(uVar9 >> 0x10);
      bVar20 = (byte)(uVar9 >> 0x18);
      uVar32 = (undefined2)uVar9;
      uVar39 = (undefined1)(coverage >> 8);
      uVar40 = (undefined1)(coverage >> 0x10);
      bVar42 = (byte)(coverage >> 0x18);
      uVar52 = (ushort)coverage;
      if (colorProfile == (QColorTrcLut *)0x0) {
        uVar44 = src;
        if ((src < 0xff000000) && (uVar44 = uVar9, src != 0)) {
          uVar10 = (ulong)(~src >> 0x18) * ((uVar10 << 0x18 | uVar10) & 0xff00ff00ff00ff);
          uVar10 = uVar10 + 0x80008000800080 + (uVar10 >> 8 & 0xff00ff00ff00ff) >> 8 &
                   0xff00ff00ff00ff;
          uVar44 = ((uint)(uVar10 >> 0x18) | (uint)uVar10) + src;
        }
        uVar2 = CONCAT25((short)(((uint7)bVar42 << 0x30) >> 0x28),CONCAT14(uVar40,coverage));
        uVar10 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar2 >> 0x20),coverage) >> 0x18),
                                 CONCAT12(uVar39,uVar52)) & 0xffffffff00ffffff;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = CONCAT62((int6)(uVar10 >> 0x10),uVar52) & 0xffffffffffff00ff;
        auVar34 = auVar34 ^ _DAT_006be540;
        uVar52 = auVar34._0_2_ * (ushort)(byte)uVar9 + (ushort)(byte)uVar44 * (uVar52 & 0xff);
        uVar41 = auVar34._2_2_ * (ushort)bVar17 +
                 (ushort)(byte)(uVar44 >> 8) * (short)(uVar10 >> 0x10);
        uVar43 = auVar34._4_2_ * (ushort)bVar18 +
                 (ushort)(byte)(uVar44 >> 0x10) * (short)((uint7)uVar2 >> 0x20);
        uVar45 = auVar34._6_2_ * (ushort)bVar20 + (ushort)(byte)(uVar44 >> 0x18) * (ushort)bVar42;
        uVar52 = (uVar52 >> 8) + uVar52 + 0x80;
        uVar19 = (uVar41 >> 8) + uVar41 + 0x80;
        uVar21 = (uVar43 >> 8) + uVar43 + 0x80;
        uVar22 = (uVar45 >> 8) + uVar45 + 0x80;
        uVar41 = uVar52 >> 8;
        uVar43 = uVar19 >> 8;
        uVar45 = uVar21 >> 8;
        uVar23 = uVar22 >> 8;
        src = CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23),
                       CONCAT12((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar21 >> 8) -
                                (0xff < uVar45),
                                CONCAT11((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar19 >> 8) -
                                         (0xff < uVar43),
                                         (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar52 >> 8) -
                                         (0xff < uVar41))));
      }
      else {
        auVar26[0] = (undefined1)coverage;
        if ((short)((ulong)srcLinear >> 0x30) == -1) {
          _Var1._M_head_impl =
               (colorProfile->m_toLinear)._M_t.
               super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
               super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          if (_Var1._M_head_impl == (unsigned_short *)0x0) {
            alphargbblend_argb32();
LAB_00670438:
            alphargbblend_argb32();
          }
          auVar33._8_8_ = 0;
          auVar33._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)bVar20
                                                                                      << 0x30) >>
                                                                                     0x28),
                                                                              CONCAT14(bVar18,uVar9)
                                                                             ) >> 0x20),uVar9) >>
                                                    0x18),CONCAT12(bVar17,uVar32)) >> 0x10),uVar32)
               & 0xffff00ff00ff00ff;
          auVar34 = psllw(auVar33,4);
          uVar41 = SUB162(ZEXT116(bVar20) << 0x38,6);
          auVar13._0_2_ =
               (_Var1._M_head_impl[auVar34._4_2_] >> 8) + _Var1._M_head_impl[auVar34._4_2_];
          auVar13._2_2_ =
               (_Var1._M_head_impl[auVar34._2_2_] >> 8) + _Var1._M_head_impl[auVar34._2_2_];
          auVar13._4_2_ =
               (_Var1._M_head_impl[auVar34._0_2_] >> 8) + _Var1._M_head_impl[auVar34._0_2_];
          auVar13._6_2_ = (uVar41 >> 8) + uVar41;
          auVar13._8_8_ = 0;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = srcLinear;
          auVar26[1] = auVar26[0];
          auVar26._2_6_ =
               (int6)(CONCAT53(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(bVar42,bVar42),uVar40),
                                                       CONCAT14(uVar40,coverage)) >> 0x20),uVar39),
                               CONCAT12(uVar39,uVar52)) >> 0x10);
          auVar26._8_8_ = 0;
          auVar35 = pshuflw(auVar26,auVar26,0xc6);
          uVar52 = -auVar35._6_2_;
          auVar48._0_12_ = ZEXT212(uVar52) << 0x30;
          auVar34 = pmulhuw(auVar24,auVar35);
          auVar48._12_2_ = uVar52;
          auVar48._14_2_ = auVar34._6_2_;
          auVar47._12_4_ = auVar48._12_4_;
          auVar47._0_10_ = (unkuint10)uVar52 << 0x30;
          auVar47._10_2_ = auVar34._4_2_;
          Var7 = CONCAT64(auVar47._10_6_,
                          CONCAT22(auVar35._4_2_ * (short)((ulong)srcLinear >> 0x20),uVar52));
          auVar3._4_8_ = (long)((unkuint10)Var7 >> 0x10);
          auVar3._2_2_ = auVar34._2_2_;
          auVar3._0_2_ = auVar35._2_2_ * (short)((ulong)srcLinear >> 0x10);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = auVar25 ^ auVar35;
          uVar52 = auVar13._6_2_ * auVar25._6_2_;
          auVar36._0_10_ = (unkuint10)uVar52 << 0x30;
          auVar37._0_12_ = ZEXT212(uVar52) << 0x30;
          auVar26 = pmulhuw(auVar25,auVar13);
          auVar37._12_2_ = uVar52;
          auVar37._14_2_ = auVar26._6_2_;
          auVar36._12_4_ = auVar37._12_4_;
          auVar36._10_2_ = auVar26._4_2_;
          Var8 = CONCAT64(auVar36._10_6_,CONCAT22(auVar13._4_2_ * auVar25._4_2_,uVar52));
          auVar4._4_8_ = (long)((unkuint10)Var8 >> 0x10);
          auVar4._2_2_ = auVar26._2_2_;
          auVar4._0_2_ = auVar13._2_2_ * auVar25._2_2_;
          uVar9 = CONCAT22(auVar26._0_2_,auVar13._0_2_ * auVar25._0_2_) +
                  CONCAT22(auVar34._0_2_,auVar35._0_2_ * (short)srcLinear);
          uVar44 = auVar4._0_4_ + auVar3._0_4_;
          uVar46 = (int)((unkuint10)Var8 >> 0x10) + (int)((unkuint10)Var7 >> 0x10);
          auVar14._0_4_ = (int)((uVar9 >> 0x10) + uVar9 + 0x8000) >> 0x10;
          auVar14._4_4_ = (int)((uVar44 >> 0x10) + uVar44 + 0x8000) >> 0x10;
          auVar14._8_4_ = (int)((uVar46 >> 0x10) + uVar46 + 0x8000) >> 0x10;
          auVar14._12_4_ =
               (int)(((uint)(auVar36._12_4_ + auVar47._12_4_) >> 0x10) +
                     auVar36._12_4_ + auVar47._12_4_ + 0x8000) >> 0x10;
          auVar34 = packssdw(auVar14,auVar14);
          rgb64.rgba = auVar34._0_8_;
        }
        else {
          uVar44 = src;
          if ((src < 0xff000000) && (uVar44 = uVar9, src != 0)) {
            uVar10 = (ulong)(~src >> 0x18) * ((uVar10 << 0x18 | uVar10) & 0xff00ff00ff00ff);
            uVar10 = uVar10 + 0x80008000800080 + (uVar10 >> 8 & 0xff00ff00ff00ff) >> 8 &
                     0xff00ff00ff00ff;
            uVar44 = ((uint)(uVar10 >> 0x18) | (uint)uVar10) + src;
          }
          _Var1._M_head_impl =
               (colorProfile->m_toLinear)._M_t.
               super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
               super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          if (_Var1._M_head_impl == (unsigned_short *)0x0) goto LAB_00670438;
          bVar31 = (byte)(uVar44 >> 0x18);
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)bVar31
                                                                                      << 0x30) >>
                                                                                     0x28),
                                                                              CONCAT14((char)(uVar44
                                                                                             >> 0x10
                                                  ),uVar44)) >> 0x20),uVar44) >> 0x18),
                                               CONCAT12((char)(uVar44 >> 8),(short)uVar44)) >> 0x10)
                               ,(short)uVar44) & 0xffff00ff00ff00ff;
          auVar34 = psllw(auVar27,4);
          uVar41 = SUB162(ZEXT116(bVar31) << 0x38,6);
          auVar28._0_2_ =
               (_Var1._M_head_impl[auVar34._4_2_] >> 8) + _Var1._M_head_impl[auVar34._4_2_];
          auVar28._2_2_ =
               (_Var1._M_head_impl[auVar34._2_2_] >> 8) + _Var1._M_head_impl[auVar34._2_2_];
          auVar28._4_2_ =
               (_Var1._M_head_impl[auVar34._0_2_] >> 8) + _Var1._M_head_impl[auVar34._0_2_];
          auVar28._6_2_ = (uVar41 >> 8) + uVar41;
          auVar28._8_8_ = 0;
          auVar49._8_8_ = 0;
          auVar49._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)bVar20
                                                                                      << 0x30) >>
                                                                                     0x28),
                                                                              CONCAT14(bVar18,uVar9)
                                                                             ) >> 0x20),uVar9) >>
                                                    0x18),CONCAT12(bVar17,uVar32)) >> 0x10),uVar32)
               & 0xffff00ff00ff00ff;
          auVar34 = psllw(auVar49,4);
          uVar41 = SUB162(ZEXT116(bVar20) << 0x38,6);
          auVar38._0_2_ =
               (_Var1._M_head_impl[auVar34._4_2_] >> 8) + _Var1._M_head_impl[auVar34._4_2_];
          auVar38._2_2_ =
               (_Var1._M_head_impl[auVar34._2_2_] >> 8) + _Var1._M_head_impl[auVar34._2_2_];
          auVar38._4_2_ =
               (_Var1._M_head_impl[auVar34._0_2_] >> 8) + _Var1._M_head_impl[auVar34._0_2_];
          auVar38._6_2_ = (uVar41 >> 8) + uVar41;
          auVar38._8_8_ = 0;
          auVar35[1] = auVar26[0];
          auVar35[0] = auVar26[0];
          auVar35._2_6_ =
               (int6)(CONCAT53(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(bVar42,bVar42),uVar40),
                                                       CONCAT14(uVar40,coverage)) >> 0x20),uVar39),
                               CONCAT12(uVar39,uVar52)) >> 0x10);
          auVar35._8_8_ = 0;
          auVar34 = pshuflw(auVar35,auVar35,0xc6);
          uVar52 = auVar34._6_2_ * auVar28._6_2_;
          auVar50._0_10_ = (unkuint10)uVar52 << 0x30;
          auVar51._0_12_ = ZEXT212(uVar52) << 0x30;
          auVar26 = pmulhuw(auVar28,auVar34);
          auVar51._12_2_ = uVar52;
          auVar51._14_2_ = auVar26._6_2_;
          auVar50._12_4_ = auVar51._12_4_;
          auVar50._10_2_ = auVar26._4_2_;
          Var7 = CONCAT64(auVar50._10_6_,CONCAT22(auVar34._4_2_ * auVar28._4_2_,uVar52));
          auVar5._4_8_ = (long)((unkuint10)Var7 >> 0x10);
          auVar5._2_2_ = auVar26._2_2_;
          auVar5._0_2_ = auVar34._2_2_ * auVar28._2_2_;
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = auVar29 ^ auVar34;
          uVar52 = auVar38._6_2_ * auVar29._6_2_;
          auVar15._0_10_ = (unkuint10)uVar52 << 0x30;
          auVar16._0_12_ = ZEXT212(uVar52) << 0x30;
          auVar35 = pmulhuw(auVar29,auVar38);
          auVar16._12_2_ = uVar52;
          auVar16._14_2_ = auVar35._6_2_;
          auVar15._12_4_ = auVar16._12_4_;
          auVar15._10_2_ = auVar35._4_2_;
          Var8 = CONCAT64(auVar15._10_6_,CONCAT22(auVar38._4_2_ * auVar29._4_2_,uVar52));
          auVar6._4_8_ = (long)((unkuint10)Var8 >> 0x10);
          auVar6._2_2_ = auVar35._2_2_;
          auVar6._0_2_ = auVar38._2_2_ * auVar29._2_2_;
          uVar9 = CONCAT22(auVar35._0_2_,auVar38._0_2_ * auVar29._0_2_) +
                  CONCAT22(auVar26._0_2_,auVar34._0_2_ * auVar28._0_2_);
          uVar44 = auVar6._0_4_ + auVar5._0_4_;
          uVar46 = (int)((unkuint10)Var8 >> 0x10) + (int)((unkuint10)Var7 >> 0x10);
          auVar30._0_4_ = (int)((uVar9 >> 0x10) + uVar9 + 0x8000) >> 0x10;
          auVar30._4_4_ = (int)((uVar44 >> 0x10) + uVar44 + 0x8000) >> 0x10;
          auVar30._8_4_ = (int)((uVar46 >> 0x10) + uVar46 + 0x8000) >> 0x10;
          auVar30._12_4_ =
               (int)(((uint)(auVar15._12_4_ + auVar50._12_4_) >> 0x10) +
                     auVar15._12_4_ + auVar50._12_4_ + 0x8000) >> 0x10;
          auVar34 = packssdw(auVar30,auVar30);
          rgb64.rgba = auVar34._0_8_;
        }
        src = QColorTrcLut::fromLinear64(colorProfile,rgb64);
      }
    }
  }
  *dst = src;
  return;
}

Assistant:

static inline void alphargbblend_argb32(quint32 *dst, uint coverage, const QRgba64 &srcLinear, quint32 src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff && qAlpha(src) == 255) {
        blend_pixel(*dst, src);
    } else if (*dst < 0xff000000) {
        // Give up and do a naive gray alphablend. Needed to deal with ARGB32 and invalid ARGB32_premultiplied, see QTBUG-60571
        blend_pixel(*dst, src, qRgbAvg(coverage));
    } else if (!colorProfile) {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then a naive blend with glyph shape
        *dst = rgbBlend(*dst, s, coverage);
    } else if (srcLinear.isOpaque()) {
        rgbBlendPixel(dst, coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        QRgba64 s64 = colorProfile ? colorProfile->toLinear64(s) : QRgba64::fromArgb32(s);
        rgbBlendPixel(dst, coverage, s64, colorProfile);
    }
}